

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::GetFrameTimestampTest::initializeExtension
          (GetFrameTimestampTest *this,Library *egl)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Library *egl_local;
  GetFrameTimestampTest *this_local;
  
  iVar1 = (*egl->_vptr_Library[0x22])(egl,"eglGetNextFrameIdANDROID");
  this->m_eglGetNextFrameIdANDROID = (eglGetNextFrameIdANDROIDFunc)CONCAT44(extraout_var,iVar1);
  dVar2 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"getProcAddress of eglGetNextFrameIdANDROID failed.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0x11f);
  iVar1 = (*egl->_vptr_Library[0x22])(egl,"eglGetCompositorTimingANDROID");
  this->m_eglGetCompositorTimingANDROID =
       (eglGetCompositorTimingANDROIDFunc)CONCAT44(extraout_var_00,iVar1);
  dVar2 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"getProcAddress of eglGetCompositorTimingANDROID failed.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0x121);
  iVar1 = (*egl->_vptr_Library[0x22])(egl,"eglGetCompositorTimingSupportedANDROID");
  this->m_eglGetCompositorTimingSupportedANDROID =
       (eglGetCompositorTimingSupportedANDROIDFunc)CONCAT44(extraout_var_01,iVar1);
  dVar2 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"getProcAddress of eglGetCompositorTimingSupportedANDROID failed.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0x123);
  iVar1 = (*egl->_vptr_Library[0x22])(egl,"eglGetFrameTimestampsANDROID");
  this->m_eglGetFrameTimestampsANDROID =
       (eglGetFrameTimestampsANDROIDFunc)CONCAT44(extraout_var_02,iVar1);
  dVar2 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"getProcAddress of eglGetFrameTimestampsANDROID failed.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0x125);
  iVar1 = (*egl->_vptr_Library[0x22])(egl,"eglGetFrameTimestampSupportedANDROID");
  this->m_eglGetFrameTimestampSupportedANDROID =
       (eglGetFrameTimestampSupportedANDROIDFunc)CONCAT44(extraout_var_03,iVar1);
  dVar2 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar2,"getProcAddress of eglGetFrameTimestampSupportedANDROID failed.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                   ,0x127);
  return;
}

Assistant:

void GetFrameTimestampTest::initializeExtension (const Library& egl)
{
	m_eglGetNextFrameIdANDROID = reinterpret_cast<eglGetNextFrameIdANDROIDFunc>(egl.getProcAddress("eglGetNextFrameIdANDROID"));
	EGLU_CHECK_MSG(egl, "getProcAddress of eglGetNextFrameIdANDROID failed.");
	m_eglGetCompositorTimingANDROID = reinterpret_cast<eglGetCompositorTimingANDROIDFunc>(egl.getProcAddress("eglGetCompositorTimingANDROID"));
	EGLU_CHECK_MSG(egl, "getProcAddress of eglGetCompositorTimingANDROID failed.");
	m_eglGetCompositorTimingSupportedANDROID = reinterpret_cast<eglGetCompositorTimingSupportedANDROIDFunc>(egl.getProcAddress("eglGetCompositorTimingSupportedANDROID"));
	EGLU_CHECK_MSG(egl, "getProcAddress of eglGetCompositorTimingSupportedANDROID failed.");
	m_eglGetFrameTimestampsANDROID = reinterpret_cast<eglGetFrameTimestampsANDROIDFunc>(egl.getProcAddress("eglGetFrameTimestampsANDROID"));
	EGLU_CHECK_MSG(egl, "getProcAddress of eglGetFrameTimestampsANDROID failed.");
	m_eglGetFrameTimestampSupportedANDROID = reinterpret_cast<eglGetFrameTimestampSupportedANDROIDFunc>(egl.getProcAddress("eglGetFrameTimestampSupportedANDROID"));
	EGLU_CHECK_MSG(egl, "getProcAddress of eglGetFrameTimestampSupportedANDROID failed.");
}